

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O1

long __thiscall glcts::AdvancedUsageMultiStage::Run(AdvancedUsageMultiStage *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *pGVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  GLuint program;
  _Alloc_hider data_00;
  long lVar5;
  uint *puVar6;
  int i_2;
  GLuint *ebo;
  int i;
  int i_3;
  long lVar7;
  ulong uVar8;
  uint local_4cc [4];
  GLint p4;
  GLint p3;
  GLint p2;
  GLuint *local_4b0;
  GLint p1;
  string local_4a0;
  GLenum draw_buffers [2];
  char *xfb_var [2];
  UVec4 data [67];
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92cc,&p1);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d2,&p2);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d0,&p3);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d6,&p4);
  if ((((p1 < 8) || (p2 < 2)) || (p3 < 8)) || (p4 < 2)) {
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4a0,
               "GL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTER_BUFFERS orGL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTERS are less than required"
               ,"");
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_4a0);
    lVar5 = 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p == &local_4a0.field_2) {
      return 0x10;
    }
    uVar8 = local_4a0.field_2._M_allocated_capacity + 1;
    data_00._M_p = local_4a0._M_dataplus._M_p;
  }
  else {
    program = glcts::anon_unknown_0::SACSubcaseBase::CreateProgram
                        (&this->super_SACSubcaseBase,
                         "#version 310 es\nlayout(location = 0) in vec4 i_vertex;\nflat out uint o_atomic_inc;\nflat out uint o_atomic_dec;\nlayout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;\nlayout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  gl_Position = i_vertex;\n  o_atomic_inc = atomicCounterIncrement(ac_counter_inc);\n  o_atomic_dec = atomicCounterDecrement(ac_counter_dec);\n}"
                         ,
                         "#version 310 es\nlayout(location = 0) out uvec4 o_color[2];\nlayout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;\nlayout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));\n  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));\n}"
                         ,false);
    this->prog_ = program;
    xfb_var[0] = "o_atomic_inc";
    xfb_var[1] = "o_atomic_dec";
    glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,program,2,xfb_var,0x8c8d);
    glcts::anon_unknown_0::SACSubcaseBase::LinkProgram(&this->super_SACSubcaseBase,this->prog_);
    data_00._M_p = (pointer)operator_new(0x400);
    lVar5 = 0;
    do {
      pcVar2 = data_00._M_p + lVar5;
      pcVar2[0] = 'd';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x400);
    buffers = &this->counter_buffer_;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x400,data_00._M_p,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    pGVar1 = this->xfb_buffer_;
    glu::CallLogWrapper::glGenBuffers(this_00,2,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*pGVar1);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
    local_4b0 = pGVar1;
    glu::CallLogWrapper::glGenTextures(this_00,2,this->rt_);
    lVar5 = 0x11;
    do {
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->xfb_buffer_[lVar5 + -0xb]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
      lVar5 = lVar5 + 1;
    } while (lVar5 == 0x12);
    pGVar1 = &this->fbo_;
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,*pGVar1);
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,this->rt_[0],0);
    ebo = (GLuint *)0xde1;
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce1,0xde1,this->rt_[1],0);
    draw_buffers[0] = 0x8ce0;
    draw_buffers[1] = 0x8ce1;
    glu::CallLogWrapper::glDrawBuffers(this_00,2,draw_buffers);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
    glcts::anon_unknown_0::SACSubcaseBase::CreateTriangle
              (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,ebo);
    glu::CallLogWrapper::glBindBufferRange(this_00,0x92c0,1,*buffers,0x10,0x20);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,7,*buffers);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*local_4b0);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,1,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,*pGVar1);
    glu::CallLogWrapper::glViewport(this_00,0,0,8,8);
    glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,4);
    glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    memset(data,0,0x430);
    glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
    glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d99,0x1405,data);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*local_4b0);
    puVar6 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8c8e,0,0xc,1);
    uVar3 = *puVar6;
    lVar5 = 0;
    do {
      local_4cc[lVar5] = uVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    data[0x40].m_data[0] = local_4cc[0];
    data[0x40].m_data[1] = local_4cc[1];
    data[0x40].m_data[2] = local_4cc[2];
    data[0x40].m_data[3] = local_4cc[3];
    uVar3 = puVar6[1];
    lVar5 = 0;
    do {
      local_4cc[lVar5] = uVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    data[0x41].m_data[0] = local_4cc[0];
    data[0x41].m_data[1] = local_4cc[1];
    data[0x41].m_data[2] = local_4cc[2];
    data[0x41].m_data[3] = local_4cc[3];
    uVar3 = puVar6[2];
    lVar5 = 0;
    do {
      local_4cc[lVar5] = uVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    data[0x42].m_data[0] = local_4cc[0];
    data[0x42].m_data[1] = local_4cc[1];
    data[0x42].m_data[2] = local_4cc[2];
    data[0x42].m_data[3] = local_4cc[3];
    bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x43,(GLuint)data,(UVec4 *)0x64,4);
    lVar5 = -1;
    if (bVar4) {
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x8c8e);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
      glu::CallLogWrapper::glReadBuffer(this_00,0x8ce1);
      glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d99,0x1405,data);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_[1]);
      puVar6 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8c8e,0,0xc,1);
      uVar3 = *puVar6;
      lVar7 = 0;
      do {
        local_4cc[lVar7] = uVar3;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      data[0x40].m_data[0] = local_4cc[0];
      data[0x40].m_data[1] = local_4cc[1];
      data[0x40].m_data[2] = local_4cc[2];
      data[0x40].m_data[3] = local_4cc[3];
      uVar3 = puVar6[1];
      lVar7 = 0;
      do {
        local_4cc[lVar7] = uVar3;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      data[0x41].m_data[0] = local_4cc[0];
      data[0x41].m_data[1] = local_4cc[1];
      data[0x41].m_data[2] = local_4cc[2];
      data[0x41].m_data[3] = local_4cc[3];
      uVar3 = puVar6[2];
      lVar7 = 0;
      do {
        local_4cc[lVar7] = uVar3;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      data[0x42].m_data[0] = local_4cc[0];
      data[0x42].m_data[1] = local_4cc[1];
      data[0x42].m_data[2] = local_4cc[2];
      data[0x42].m_data[3] = local_4cc[3];
      bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                        ((SACSubcaseBase *)0x43,(GLuint)data,(UVec4 *)0x21,(int)data + 0x420);
      if (bVar4) {
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x8c8e);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
        bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                          (&this->super_SACSubcaseBase,this->counter_buffer_,0x20,0xa7);
        if (bVar4) {
          bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                            (&this->super_SACSubcaseBase,this->counter_buffer_,0x80,0x21);
          lVar5 = (ulong)bVar4 - 1;
        }
      }
    }
    uVar8 = 0x400;
  }
  operator_delete(data_00._M_p,uVar8);
  return lVar5;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2, p3, p4;
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &p2);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p3);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, &p4);
		if (p1 < 8 || p2 < 2 || p3 < 8 || p4 < 2)
		{
			OutputNotSupported("GL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTER_BUFFERS or"
							   "GL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTERS are less than required");
			return NOT_SUPPORTED;
		}

		// create program
		const char* src_vs =
			"#version 310 es" NL "layout(location = 0) in vec4 i_vertex;" NL "flat out uint o_atomic_inc;" NL
			"flat out uint o_atomic_dec;" NL "layout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;" NL
			"layout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;" NL "void main() {" NL
			"  gl_Position = i_vertex;" NL "  o_atomic_inc = atomicCounterIncrement(ac_counter_inc);" NL
			"  o_atomic_dec = atomicCounterDecrement(ac_counter_dec);" NL "}";
		const char* src_fs = "#version 310 es" NL "layout(location = 0) out uvec4 o_color[2];" NL
							 "layout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;" NL
							 "layout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;" NL
							 "void main() {" NL "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));" NL
							 "  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));" NL "}";
		prog_				   = CreateProgram(src_vs, src_fs, false);
		const char* xfb_var[2] = { "o_atomic_inc", "o_atomic_dec" };
		glTransformFeedbackVaryings(prog_, 2, xfb_var, GL_SEPARATE_ATTRIBS);
		LinkProgram(prog_);

		// create atomic counter buffer
		std::vector<GLuint> init_data(256, 100);
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, (GLsizeiptr)(init_data.size() * sizeof(GLuint)), &init_data[0],
					 GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create transform feedback buffers
		glGenBuffers(2, xfb_buffer_);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		// create render targets
		const int s = 8;
		glGenTextures(2, rt_);
		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, rt_[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, rt_[0], 0);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, GL_TEXTURE_2D, rt_[1], 0);
		const GLenum draw_buffers[2] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
		glDrawBuffers(2, draw_buffers);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateTriangle(&vao_, &vbo_, NULL);

		// draw
		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, 1, counter_buffer_, 16, 32);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 7, counter_buffer_);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, xfb_buffer_[0]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, xfb_buffer_[1]);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glBeginTransformFeedback(GL_TRIANGLES);
		glDrawArrays(GL_TRIANGLES, 0, 3);
		glEndTransformFeedback();

		// validate
		UVec4 data[s * s + 3];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RGBA_INTEGER, GL_UNSIGNED_INT, data);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		GLuint* data2;
		data2 = static_cast<GLuint*>(
			glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 3 * sizeof(GLuint), GL_MAP_READ_BIT));
		data[s * s]		= UVec4(data2[0]);
		data[s * s + 1] = UVec4(data2[1]);
		data[s * s + 2] = UVec4(data2[2]);
		if (!CheckCounterValues(s * s + 3, data, 100))
			return ERROR;
		glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		glReadBuffer(GL_COLOR_ATTACHMENT1);
		glReadPixels(0, 0, s, s, GL_RGBA_INTEGER, GL_UNSIGNED_INT, data);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		data2 = static_cast<GLuint*>(
			glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 3 * sizeof(GLuint), GL_MAP_READ_BIT));
		data[s * s]		= UVec4(data2[0]);
		data[s * s + 1] = UVec4(data2[1]);
		data[s * s + 2] = UVec4(data2[2]);
		if (!CheckCounterValues(s * s + 3, data, 33))
			return ERROR;
		glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		if (!CheckFinalCounterValue(counter_buffer_, 32, 167))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 128, 33))
			return ERROR;

		return NO_ERROR;
	}